

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_test.cpp
# Opt level: O2

int findParam(string *param,int argc,char **argv)

{
  __type _Var1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = 0;
  for (uVar2 = 0xffffffffffffffff; ((long)uVar3 < (long)argc && ((int)uVar2 == -1));
      uVar2 = uVar2 & 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[uVar3],&local_51);
    _Var1 = std::operator==(&local_50,param);
    std::__cxx11::string::~string((string *)&local_50);
    uVar2 = 0xffffffffffffffff;
    if (_Var1) {
      uVar2 = uVar3;
    }
    uVar3 = uVar3 + 1;
  }
  return (int)uVar2;
}

Assistant:

int findParam ( string param,int argc,char **argv ) {
    int idx=-1;
    for ( int i=0; i<argc && idx==-1; i++ )
        if ( string ( argv[i] ) ==param ) idx=i;
    return idx;

}